

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubroutineSymbols.cpp
# Opt level: O2

pair<slang::ast::SubroutineSymbol_*,_bool>
slang::ast::SubroutineSymbol::fromSyntax
          (Compilation *compilation,FunctionDeclarationSyntax *syntax,Scope *parent,bool outOfBlock)

{
  undefined1 *puVar1;
  SymbolKind SVar2;
  uint uVar3;
  FunctionPrototypeSyntax *pFVar4;
  ScopedNameSyntax *name;
  Symbol *pSVar5;
  span<const_slang::syntax::AttributeInstanceSyntax_*const,_18446744073709551615UL> syntax_00;
  Token token;
  bool bVar6;
  undefined1 auVar7 [16];
  bool bVar8;
  bitmask<slang::ast::MethodFlags> bVar9;
  int iVar10;
  SubroutineSymbol *pSVar11;
  Diagnostic *this;
  SourceLocation noteLocation;
  undefined4 extraout_var;
  VariableSymbol *symbol;
  undefined7 in_register_00000009;
  Scope *pSVar12;
  FunctionPortListSyntax *extraout_RDX;
  FunctionPortListSyntax *syntax_01;
  __extent_storage<18446744073709551615UL> src;
  EVP_PKEY_CTX *extraout_RDX_00;
  EVP_PKEY_CTX *extraout_RDX_01;
  size_t extraout_RDX_02;
  FunctionPortListSyntax *extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 uVar13;
  SymbolIndex index;
  Symbol **ppSVar14;
  span<const_slang::ast::StatementBlockSymbol_*const,_18446744073709551615UL> sVar15;
  pair<slang::ast::SubroutineSymbol_*,_bool> pVar16;
  optional<slang::ast::VariableLifetime> lifetime;
  SubroutineKind subroutineKind;
  undefined1 local_90 [8];
  SourceLocation local_88;
  Token nameToken;
  SmallVector<const_slang::ast::FormalArgumentSymbol_*,_5UL> arguments;
  
  local_88 = (SourceLocation)local_90;
  pFVar4 = (syntax->prototype).ptr;
  name = (ScopedNameSyntax *)(pFVar4->name).ptr;
  if (((int)CONCAT71(in_register_00000009,outOfBlock) == 0) &&
     ((name->super_NameSyntax).super_ExpressionSyntax.super_SyntaxNode.kind == ScopedName)) {
    if (parent->lastMember == (Symbol *)0x0) {
      index = 1;
    }
    else {
      index = parent->lastMember->indexInScope + 1;
    }
    if ((name->separator).kind != DoubleColon) {
      pVar16 = fromSyntax(compilation,syntax,parent,true);
      pSVar11 = pVar16.first;
      (pSVar11->super_Symbol).parentScope = parent;
      (pSVar11->super_Symbol).indexInScope = index;
      Compilation::addExternInterfaceMethod(compilation,pSVar11);
      uVar13 = CONCAT71((int7)((ulong)extraout_RDX_04 >> 8),1);
      pSVar11 = (SubroutineSymbol *)0x0;
      goto LAB_002da41d;
    }
    Compilation::addOutOfBlockDecl(compilation,parent,name,(SyntaxNode *)syntax,index);
    pSVar11 = (SubroutineSymbol *)0x0;
  }
  else {
    nameToken = slang::syntax::SyntaxNode::getLastToken((SyntaxNode *)name);
    token.kind = (pFVar4->lifetime).kind;
    token._2_1_ = (pFVar4->lifetime).field_0x2;
    token.numFlags.raw = (pFVar4->lifetime).numFlags.raw;
    token.rawLen = (pFVar4->lifetime).rawLen;
    token.info = (pFVar4->lifetime).info;
    lifetime = SemanticFacts::getVariableLifetime(token);
    if (((ulong)lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
                super__Optional_payload_base<slang::ast::VariableLifetime> >> 0x20 & 1) == 0) {
      lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
      super__Optional_payload_base<slang::ast::VariableLifetime> =
           (_Optional_base<slang::ast::VariableLifetime,_true,_true>)
           (_Optional_payload<slang::ast::VariableLifetime,_true,_true,_true>)0x100000001;
      pSVar12 = parent;
      do {
        pSVar5 = pSVar12->thisSym;
        SVar2 = pSVar5->kind;
        if (SVar2 == ClassType) {
          lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::VariableLifetime> =
               (_Optional_base<slang::ast::VariableLifetime,_true,_true>)
               (_Optional_payload<slang::ast::VariableLifetime,_true,_true,_true>)0x100000000;
          break;
        }
        if (SVar2 == Package) {
          uVar3 = (uint)pSVar5[2].name._M_len;
LAB_002da206:
          lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
          super__Optional_payload_base<slang::ast::VariableLifetime> =
               (_Optional_base<slang::ast::VariableLifetime,_true,_true>)
               ((ulong)uVar3 | 0x100000000);
          break;
        }
        if (SVar2 == InstanceBody) {
          uVar3 = *(uint *)(pSVar5[2].name._M_str + 0x4c);
          goto LAB_002da206;
        }
        pSVar12 = pSVar5->parentScope;
      } while (pSVar12 != (Scope *)0x0);
    }
    subroutineKind =
         (SubroutineKind)((syntax->super_MemberSyntax).super_SyntaxNode.kind == TaskDeclaration);
    arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>._0_16_ =
         parsing::Token::valueText(&nameToken);
    local_90 = (undefined1  [8])parsing::Token::location(&nameToken);
    pSVar11 = BumpAllocator::
              emplace<slang::ast::SubroutineSymbol,slang::ast::Compilation&,std::basic_string_view<char,std::char_traits<char>>,slang::SourceLocation,slang::ast::VariableLifetime&,slang::ast::SubroutineKind&>
                        (&compilation->super_BumpAllocator,compilation,
                         (basic_string_view<char,_std::char_traits<char>_> *)&arguments,
                         (SourceLocation *)local_90,(VariableLifetime *)&lifetime,&subroutineKind);
    (pSVar11->super_Symbol).originatingSyntax = (SyntaxNode *)syntax;
    syntax_00._M_ptr =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_ptr;
    syntax_00._M_extent._M_extent_value =
         (syntax->super_MemberSyntax).attributes.
         super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>._M_extent.
         _M_extent_value;
    Symbol::setAttributes(&pSVar11->super_Symbol,parent,syntax_00);
    arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.len = 0;
    arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.data_ =
         (pointer)arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.
                  firstElement;
    arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>.cap = 5;
    syntax_01 = pFVar4->portList;
    if (syntax_01 != (FunctionPortListSyntax *)0x0) {
      bVar9 = buildArguments(&pSVar11->super_Scope,parent,syntax_01,
                             lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>
                             ._M_payload.super__Optional_payload_base<slang::ast::VariableLifetime>.
                             _M_payload._M_value,
                             &arguments.
                              super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>);
      (pSVar11->flags).m_bits = (pSVar11->flags).m_bits | bVar9.m_bits;
      syntax_01 = extraout_RDX;
    }
    if (nameToken.kind == NewKeyword) {
      *(byte *)&(pSVar11->flags).m_bits = (byte)(pSVar11->flags).m_bits | 8;
LAB_002da2e8:
      (pSVar11->declaredReturnType).type = compilation->voidType;
    }
    else {
      if (subroutineKind != Function) goto LAB_002da2e8;
      auVar7._12_4_ = 0;
      auVar7._0_12_ = stack0xffffffffffffff74;
      _local_90 = (Token)(auVar7 << 0x20);
      symbol = BumpAllocator::
               emplace<slang::ast::VariableSymbol,std::basic_string_view<char,std::char_traits<char>>&,slang::SourceLocation&,slang::ast::VariableLifetime>
                         (&compilation->super_BumpAllocator,&(pSVar11->super_Symbol).name,
                          &(pSVar11->super_Symbol).location,(VariableLifetime *)local_90);
      (symbol->super_ValueSymbol).declaredType.typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar4->returnType).ptr;
      puVar1 = &(symbol->super_ValueSymbol).declaredType.field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      *(byte *)&(symbol->flags).m_bits = (byte)(symbol->flags).m_bits | 2;
      Scope::addMember(&pSVar11->super_Scope,(Symbol *)symbol);
      pSVar11->returnValVar = symbol;
      (pSVar11->declaredReturnType).typeOrLink =
           (anon_union_8_2_f12d5f64_for_typeOrLink)(pFVar4->returnType).ptr;
      puVar1 = &(pSVar11->declaredReturnType).field_0x3f;
      *puVar1 = *puVar1 & 0x7f;
      syntax_01 = extraout_RDX_03;
    }
    pSVar5 = (pSVar11->super_Scope).lastMember;
    sVar15 = Statement::createAndAddBlockItems
                       ((Statement *)&pSVar11->super_Scope,(Scope *)&syntax->items,
                        (SyntaxList<slang::syntax::SyntaxNode> *)syntax_01);
    src = sVar15._M_extent._M_extent_value;
    (pSVar11->blocks)._M_ptr = sVar15._M_ptr;
    ppSVar14 = &(pSVar11->super_Scope).firstMember;
    if (pSVar5 != (Symbol *)0x0) {
      ppSVar14 = &pSVar5->nextInScope;
    }
    (pSVar11->blocks)._M_extent._M_extent_value = src._M_extent_value;
    bVar8 = false;
    while( true ) {
      pSVar5 = *ppSVar14;
      if (pSVar5 == (Symbol *)0x0) break;
      if (pSVar5->kind == FormalArgument) {
        bVar6 = !bVar8;
        bVar8 = true;
        if (bVar6) {
          if (pFVar4->portList == (FunctionPortListSyntax *)0x0) {
            bVar8 = false;
          }
          else {
            this = Scope::addDiag(parent,(DiagCode)0x810006,pSVar5->location);
            _local_90 = slang::syntax::SyntaxNode::getFirstToken
                                  (&pFVar4->portList->super_SyntaxNode);
            noteLocation = parsing::Token::location((Token *)local_90);
            Diagnostic::addNote(this,(DiagCode)0x50001,noteLocation);
          }
        }
        local_90 = (undefined1  [8])pSVar5;
        SmallVectorBase<slang::ast::FormalArgumentSymbol_const*>::
        emplace_back<slang::ast::FormalArgumentSymbol_const*>
                  ((SmallVectorBase<slang::ast::FormalArgumentSymbol_const*> *)&arguments,
                   (FormalArgumentSymbol **)local_90);
        src._M_extent_value = (size_t)extraout_RDX_00;
        if (((lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
              super__Optional_payload_base<slang::ast::VariableLifetime>._M_engaged == true) &&
            (lifetime.super__Optional_base<slang::ast::VariableLifetime,_true,_true>._M_payload.
             super__Optional_payload_base<slang::ast::VariableLifetime>._M_payload._M_value ==
             Static)) && (*(int *)&pSVar5[5].location == 3)) {
          Scope::addDiag(parent,(DiagCode)0xbb0006,pSVar5->location);
          src._M_extent_value = (size_t)extraout_RDX_01;
        }
      }
      ppSVar14 = &pSVar5->nextInScope;
    }
    iVar10 = SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::copy
                       (&arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
                        (EVP_PKEY_CTX *)compilation,(EVP_PKEY_CTX *)src._M_extent_value);
    (pSVar11->arguments)._M_ptr = (pointer)CONCAT44(extraout_var,iVar10);
    (pSVar11->arguments)._M_extent._M_extent_value = extraout_RDX_02;
    SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>::cleanup
              (&arguments.super_SmallVectorBase<const_slang::ast::FormalArgumentSymbol_*>,
               (EVP_PKEY_CTX *)compilation);
  }
  uVar13 = 0;
LAB_002da41d:
  pVar16._8_8_ = uVar13;
  pVar16.first = pSVar11;
  return pVar16;
}

Assistant:

std::pair<SubroutineSymbol*, bool> SubroutineSymbol::fromSyntax(
    Compilation& compilation, const FunctionDeclarationSyntax& syntax, const Scope& parent,
    bool outOfBlock) {

    // If this subroutine has a scoped name, it should be an out of block declaration.
    // We shouldn't create a symbol now, since we need the class prototype to hook
    // us in to the correct scope. Register this syntax with the compilation so that
    // it can later be found by the prototype.
    auto proto = syntax.prototype;
    if (!outOfBlock && proto->name->kind == SyntaxKind::ScopedName) {
        // Remember the location in the parent scope where we *would* have inserted this
        // subroutine, for later use during lookup.
        uint32_t index = 1;
        if (auto last = parent.getLastMember())
            index = (uint32_t)last->getIndex() + 1;

        bool isExternIfaceMethod = false;
        auto& scopedName = proto->name->as<ScopedNameSyntax>();
        if (scopedName.separator.kind == TokenKind::DoubleColon) {
            // This is an out-of-block class method implementation.
            compilation.addOutOfBlockDecl(parent, scopedName, syntax, SymbolIndex(index));
        }
        else {
            // Otherwise this is an interface method implementation.
            // We should create the method like normal but not add it to
            // the parent name map (because it can only be looked up via
            // the interface instance).
            auto [result, _] = SubroutineSymbol::fromSyntax(compilation, syntax, parent,
                                                            /* outOfBlock */ true);
            SLANG_ASSERT(result);

            result->setParent(parent, SymbolIndex(index));
            compilation.addExternInterfaceMethod(*result);
            isExternIfaceMethod = true;
        }
        return {nullptr, isExternIfaceMethod};
    }

    Token nameToken = proto->name->getLastToken();
    auto lifetime = SemanticFacts::getVariableLifetime(proto->lifetime);
    if (!lifetime.has_value()) {
        // Walk up to the nearest instance and use its default lifetime.
        // If we're not within an instance, default to static.
        lifetime = VariableLifetime::Static;
        auto scope = &parent;
        do {
            auto& sym = scope->asSymbol();
            if (sym.kind == SymbolKind::InstanceBody) {
                lifetime = sym.as<InstanceBodySymbol>().getDefinition().defaultLifetime;
                break;
            }
            else if (sym.kind == SymbolKind::ClassType) {
                lifetime = VariableLifetime::Automatic;
                break;
            }
            else if (sym.kind == SymbolKind::Package) {
                lifetime = sym.as<PackageSymbol>().defaultLifetime;
                break;
            }
            scope = sym.getParentScope();
        } while (scope);
    }

    auto subroutineKind = syntax.kind == SyntaxKind::TaskDeclaration ? SubroutineKind::Task
                                                                     : SubroutineKind::Function;
    auto result = compilation.emplace<SubroutineSymbol>(compilation, nameToken.valueText(),
                                                        nameToken.location(), *lifetime,
                                                        subroutineKind);

    result->setSyntax(syntax);
    result->setAttributes(parent, syntax.attributes);

    SmallVector<const FormalArgumentSymbol*> arguments;
    if (proto->portList)
        result->flags |= buildArguments(*result, parent, *proto->portList, *lifetime, arguments);

    if (nameToken.kind == TokenKind::NewKeyword) {
        result->flags |= MethodFlags::Constructor;
        result->declaredReturnType.setType(compilation.getVoidType());
    }
    else if (subroutineKind == SubroutineKind::Function) {
        // The function gets an implicit variable inserted that represents the return value.
        auto implicitReturnVar = compilation.emplace<VariableSymbol>(result->name, result->location,
                                                                     VariableLifetime::Automatic);
        implicitReturnVar->setDeclaredType(*proto->returnType);
        implicitReturnVar->flags |= VariableFlags::CompilerGenerated;
        result->addMember(*implicitReturnVar);
        result->returnValVar = implicitReturnVar;
        result->declaredReturnType.setTypeSyntax(*proto->returnType);
    }
    else {
        result->declaredReturnType.setType(compilation.getVoidType());
    }

    const Symbol* last = result->getLastMember();
    result->blocks = Statement::createAndAddBlockItems(*result, syntax.items);

    // Subroutines can also declare arguments inside their bodies as port declarations.
    // Find them by walking through members that were added by setItems().
    if (!last)
        last = result->getFirstMember();
    else
        last = last->getNextSibling();

    bool portListError = false;
    while (last) {
        if (last->kind == SymbolKind::FormalArgument) {
            if (!portListError && proto->portList) {
                auto& diag = parent.addDiag(diag::MixingSubroutinePortKinds, last->location);
                diag.addNote(diag::NoteDeclarationHere,
                             proto->portList->getFirstToken().location());
                portListError = true;
            }

            auto& arg = last->as<FormalArgumentSymbol>();
            arguments.push_back(&arg);

            if (lifetime == VariableLifetime::Static && arg.direction == ArgumentDirection::Ref)
                parent.addDiag(diag::RefArgAutomaticFunc, last->location);
        }
        last = last->getNextSibling();
    }

    result->arguments = arguments.copy(compilation);
    return {result, false};
}